

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O0

sat_solver *
Bmc_DeriveSolver(Gia_Man_t *p,Gia_Man_t *pMiter,Cnf_Dat_t *pCnf,int nFramesMax,int nTimeOut,
                int fVerbose)

{
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  sat_solver *s;
  abctime aVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  bool bVar11;
  abctime local_90;
  int local_70;
  int VarShift;
  int iVarOut;
  int iVar1;
  int iVar0;
  int k;
  int i;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  int fVerbose_local;
  int nTimeOut_local;
  int nFramesMax_local;
  Cnf_Dat_t *pCnf_local;
  Gia_Man_t *pMiter_local;
  Gia_Man_t *p_local;
  
  s = sat_solver_new();
  iVar2 = Gia_ManRegNum(p);
  iVar3 = Gia_ManCoNum(p);
  sat_solver_setnvars(s,iVar2 + iVar3 + pCnf->nVars * (nFramesMax + 1));
  if (nTimeOut == 0) {
    local_90 = 0;
  }
  else {
    aVar6 = Abc_Clock();
    local_90 = (long)nTimeOut * 1000000 + aVar6;
  }
  sat_solver_set_runtime_limit(s,local_90);
  iVar2 = Gia_ManCoNum(p);
  p_00 = Vec_IntAlloc(iVar2);
  iVar0 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCos);
    bVar11 = false;
    if (iVar0 < iVar2) {
      pObj0 = Gia_ManCo(p,iVar0);
      bVar11 = pObj0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    iVar2 = Gia_ManRegNum(p);
    iVar2 = Abc_Var2Lit(iVar2 + iVar0,0);
    Vec_IntPush(p_00,iVar2);
    iVar0 = iVar0 + 1;
  }
  piVar7 = Vec_IntArray(p_00);
  piVar8 = Vec_IntArray(p_00);
  iVar2 = Vec_IntSize(p_00);
  sat_solver_addclause(s,piVar7,piVar8 + iVar2);
  iVar2 = Gia_ManRegNum(p);
  iVar3 = Gia_ManCoNum(p);
  Cnf_DataLiftGia(pCnf,pMiter,iVar2 + iVar3);
  local_70 = Gia_ManRegNum(p);
  iVar2 = Gia_ManCoNum(p);
  local_70 = local_70 + iVar2;
  iVar0 = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(p);
    bVar11 = false;
    if (iVar0 < iVar2) {
      pObj0 = Gia_ManCo(p,iVar0);
      bVar11 = pObj0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    pGVar9 = Gia_ManPo(pMiter,iVar0 << 1);
    pGVar10 = Gia_ManPo(pMiter,iVar0 * 2 + 1);
    piVar7 = pCnf->pVarNums;
    iVar2 = Gia_ObjId(pMiter,pGVar9);
    iVar2 = piVar7[iVar2];
    piVar7 = pCnf->pVarNums;
    iVar3 = Gia_ObjId(pMiter,pGVar10);
    iVar3 = piVar7[iVar3];
    iVar4 = Gia_ManRegNum(p);
    sat_solver_add_xor(s,iVar2,iVar3,iVar4 + iVar0,0);
    iVar0 = iVar0 + 1;
  }
  iVar0 = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar11 = false;
    if (iVar0 < iVar2) {
      iVar2 = Gia_ManPoNum(p);
      pObj0 = Gia_ManCo(p,iVar2 + iVar0);
      bVar11 = pObj0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    pGVar9 = Gia_ManRi(pMiter,iVar0);
    iVar2 = Gia_ManRegNum(p);
    pGVar10 = Gia_ManRi(pMiter,iVar0 + iVar2);
    piVar7 = pCnf->pVarNums;
    iVar2 = Gia_ObjId(pMiter,pGVar9);
    iVar2 = piVar7[iVar2];
    piVar7 = pCnf->pVarNums;
    iVar3 = Gia_ObjId(pMiter,pGVar10);
    iVar3 = piVar7[iVar3];
    iVar4 = Gia_ManRegNum(p);
    iVar5 = Gia_ManPoNum(p);
    sat_solver_add_xor_and(s,iVar4 + iVar5 + iVar0,iVar2,iVar3,iVar0);
    iVar0 = iVar0 + 1;
  }
  iVar0 = 0;
  while( true ) {
    if (pCnf->nClauses <= iVar0) {
      iVar1 = 0;
      do {
        if (nFramesMax <= iVar1) {
          Cnf_DataLiftGia(pCnf,pMiter,-local_70);
          Vec_IntFree(p_00);
          return s;
        }
        Vec_IntClear(p_00);
        iVar0 = 0;
        while( true ) {
          iVar2 = Gia_ManRegNum(pMiter);
          bVar11 = false;
          if (iVar0 < iVar2) {
            iVar2 = Gia_ManPiNum(pMiter);
            pObj0 = Gia_ManCi(pMiter,iVar2 + iVar0);
            bVar11 = pObj0 != (Gia_Obj_t *)0x0;
          }
          if (!bVar11) break;
          piVar7 = pCnf->pVarNums;
          iVar2 = Gia_ObjId(pMiter,pObj0);
          Vec_IntPush(p_00,piVar7[iVar2]);
          iVar0 = iVar0 + 1;
        }
        Cnf_DataLiftGia(pCnf,pMiter,pCnf->nVars);
        local_70 = pCnf->nVars + local_70;
        iVar0 = 0;
        while( true ) {
          iVar2 = Gia_ManRegNum(pMiter);
          bVar11 = false;
          if (iVar0 < iVar2) {
            iVar2 = Gia_ManPoNum(pMiter);
            pObj0 = Gia_ManCo(pMiter,iVar2 + iVar0);
            bVar11 = pObj0 != (Gia_Obj_t *)0x0;
          }
          if (!bVar11) break;
          piVar7 = pCnf->pVarNums;
          iVar2 = Gia_ObjId(pMiter,pObj0);
          iVar2 = piVar7[iVar2];
          iVar3 = Vec_IntEntry(p_00,iVar0);
          if (iVar3 != -1) {
            sat_solver_add_buffer(s,iVar2,iVar3,0);
          }
          iVar0 = iVar0 + 1;
        }
        iVar0 = 0;
        while( true ) {
          iVar2 = Gia_ManPoNum(p);
          bVar11 = false;
          if (iVar0 < iVar2) {
            pObj0 = Gia_ManCo(p,iVar0);
            bVar11 = pObj0 != (Gia_Obj_t *)0x0;
          }
          if (!bVar11) break;
          pGVar9 = Gia_ManPo(pMiter,iVar0 << 1);
          pGVar10 = Gia_ManPo(pMiter,iVar0 * 2 + 1);
          piVar7 = pCnf->pVarNums;
          iVar2 = Gia_ObjId(pMiter,pGVar9);
          iVar2 = piVar7[iVar2];
          piVar7 = pCnf->pVarNums;
          iVar3 = Gia_ObjId(pMiter,pGVar10);
          sat_solver_add_buffer(s,iVar2,piVar7[iVar3],0);
          iVar0 = iVar0 + 1;
        }
        iVar0 = 0;
        while( true ) {
          iVar2 = Gia_ManRegNum(p);
          bVar11 = false;
          if (iVar0 < iVar2) {
            iVar2 = Gia_ManPoNum(p);
            pObj0 = Gia_ManCo(p,iVar2 + iVar0);
            bVar11 = pObj0 != (Gia_Obj_t *)0x0;
          }
          if (!bVar11) break;
          pGVar9 = Gia_ManRi(pMiter,iVar0);
          iVar2 = Gia_ManRegNum(p);
          pGVar10 = Gia_ManRi(pMiter,iVar0 + iVar2);
          piVar7 = pCnf->pVarNums;
          iVar2 = Gia_ObjId(pMiter,pGVar9);
          iVar2 = piVar7[iVar2];
          piVar7 = pCnf->pVarNums;
          iVar3 = Gia_ObjId(pMiter,pGVar10);
          sat_solver_add_buffer_enable(s,iVar2,piVar7[iVar3],iVar0,0);
          iVar0 = iVar0 + 1;
        }
        for (iVar0 = 0; iVar0 < pCnf->nClauses; iVar0 = iVar0 + 1) {
          iVar2 = sat_solver_addclause(s,pCnf->pClauses[iVar0],pCnf->pClauses[iVar0 + 1]);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                          ,0xb1,
                          "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
                         );
          }
        }
        iVar1 = iVar1 + 1;
      } while( true );
    }
    iVar2 = sat_solver_addclause(s,pCnf->pClauses[iVar0],pCnf->pClauses[iVar0 + 1]);
    if (iVar2 == 0) break;
    iVar0 = iVar0 + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                ,0x88,
                "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
               );
}

Assistant:

sat_solver * Bmc_DeriveSolver( Gia_Man_t * p, Gia_Man_t * pMiter, Cnf_Dat_t * pCnf, int nFramesMax, int nTimeOut, int fVerbose )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj, * pObj0, * pObj1;
    int i, k, iVar0, iVar1, iVarOut;
    int VarShift = 0;

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManRegNum(p) + Gia_ManCoNum(p) + pCnf->nVars * (nFramesMax + 1) );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(Gia_ManRegNum(p) + i, 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // load the last timeframe
    Cnf_DataLiftGia( pCnf, pMiter, Gia_ManRegNum(p) + Gia_ManCoNum(p) );
    VarShift += Gia_ManRegNum(p) + Gia_ManCoNum(p);

    // add XOR clauses
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj0 = Gia_ManPo( pMiter, 2*i+0 );
        pObj1 = Gia_ManPo( pMiter, 2*i+1 );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + i;
        sat_solver_add_xor( pSat, iVar0, iVar1, iVarOut, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
    {
        pObj0 = Gia_ManRi( pMiter, i );
        pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + Gia_ManPoNum(p) + i;
        sat_solver_add_xor_and( pSat, iVarOut, iVar0, iVar1, i );
    }
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add other timeframes
    for ( k = 0; k < nFramesMax; k++ )
    {
        // collect variables of the RO nodes
        Vec_IntClear( vLits );
        Gia_ManForEachRo( pMiter, pObj, i )
            Vec_IntPush( vLits, pCnf->pVarNums[Gia_ObjId(pMiter, pObj)] );
        // lift CNF again
        Cnf_DataLiftGia( pCnf, pMiter, pCnf->nVars );
        VarShift += pCnf->nVars;
        // stitch the clauses
        Gia_ManForEachRi( pMiter, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj)];
            iVar1 = Vec_IntEntry( vLits, i );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // add equality clauses for the COs
        Gia_ManForEachPo( p, pObj, i )
        {
            pObj0 = Gia_ManPo( pMiter, 2*i+0 );
            pObj1 = Gia_ManPo( pMiter, 2*i+1 );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
        {
            pObj0 = Gia_ManRi( pMiter, i );
            pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer_enable( pSat, iVar0, iVar1, i, 0 );
        }
        // add timeframe clauses
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
//    sat_solver_compress( pSat );
    Cnf_DataLiftGia( pCnf, pMiter, -VarShift );
    Vec_IntFree( vLits );
    return pSat;
}